

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<Function>::copyAppend
          (QGenericArrayOps<Function> *this,Function *b,Function *e)

{
  qsizetype *pqVar1;
  Function *pFVar2;
  
  if (b != e) {
    pFVar2 = (this->super_QArrayDataPointer<Function>).ptr;
    for (; b < e; b = b + 1) {
      Function::Function(pFVar2 + (this->super_QArrayDataPointer<Function>).size,b);
      pqVar1 = &(this->super_QArrayDataPointer<Function>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }